

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O0

int __thiscall TPZCheckMesh::CheckConstraintDimension(TPZCheckMesh *this)

{
  bool bVar1;
  int iVar2;
  TPZAdmChunkVector<TPZConnect,_10> *this_00;
  int64_t iVar3;
  ostream *poVar4;
  void *pvVar5;
  long *plVar6;
  reference plVar7;
  long lVar8;
  TPZCompElSide *this_01;
  undefined4 extraout_var;
  TPZCompEl *pTVar9;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar10;
  iterator it_1;
  int ic_3;
  TPZDepend *dep_1;
  TPZConnect *c_1;
  int icl;
  set<long,_std::less<long>,_std::allocator<long>_> largecon;
  int nclarge;
  int i;
  TPZStack<TPZCompElSide,_10> equal;
  TPZGeoElSide gellarge;
  TPZCompElSide large;
  TPZGeoElSide gelside;
  TPZGeoEl *ref;
  int ic_2;
  int nc_1;
  TPZInterpolatedElement *intel;
  TPZCompEl *cel_1;
  iterator it;
  set<long,_std::less<long>,_std::allocator<long>_> badelements;
  int64_t cindex;
  int ic_1;
  int nc;
  TPZCompEl *cel;
  int64_t el;
  int64_t nelem;
  TPZVec<long> connecttoel;
  int jblsize;
  int jseqnum;
  TPZConnect *jcon;
  int jcind;
  int c;
  int r;
  TPZDepend *dep;
  int iblsize;
  int iseqnum;
  TPZConnect *con;
  int64_t ic;
  set<long,_std::less<long>,_std::allocator<long>_> badcon;
  int ncon;
  int check;
  undefined4 in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  TPZCompMesh *in_stack_fffffffffffff9f0;
  TPZGeoEl *in_stack_fffffffffffff9f8;
  TPZVec<long> *in_stack_fffffffffffffa00;
  TPZCompElSide *in_stack_fffffffffffffa08;
  TPZChunkVector<TPZConnect,_10> *in_stack_fffffffffffffa10;
  int64_t in_stack_fffffffffffffaf0;
  TPZCompEl *in_stack_fffffffffffffaf8;
  TPZGeoElSide *in_stack_fffffffffffffb00;
  long *local_488;
  TPZDepend *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  _Self local_320;
  _Self local_318;
  _Base_ptr local_310;
  uint local_304;
  _Self local_300;
  _Self local_2f8;
  TPZDepend *local_2f0;
  TPZConnect *local_2e8;
  _Base_ptr local_2e0;
  undefined1 local_2d8;
  undefined8 local_2d0;
  int local_2c4;
  int local_28c;
  _Base_ptr local_288;
  undefined1 local_280;
  int64_t local_278;
  int local_26c;
  TPZCompElSide local_268;
  TPZVec<TPZCompElSide> local_258 [6];
  undefined4 local_17c;
  TPZCompElSide local_178 [2];
  TPZGeoEl *local_150;
  int local_148;
  int local_144;
  long *local_140;
  TPZCompEl *local_138;
  _Self local_130;
  _Self local_128 [7];
  int64_t local_f0;
  int local_e8;
  int local_e4;
  TPZCompEl *local_e0;
  long local_d8;
  long local_d0;
  undefined8 local_c8;
  TPZVec<long> local_c0;
  _Base_ptr local_a0;
  undefined1 local_98;
  int local_90;
  undefined4 local_8c;
  TPZConnect *local_88;
  int local_7c;
  int local_78;
  int local_74;
  TPZDepend *local_70;
  int local_64;
  int local_60;
  TPZConnect *local_50;
  long local_48;
  int local_10;
  int local_c;
  
  local_c = 0;
  this_00 = TPZCompMesh::ConnectVec((TPZCompMesh *)*in_RDI);
  iVar3 = TPZChunkVector<TPZConnect,_10>::NElements(&this_00->super_TPZChunkVector<TPZConnect,_10>);
  local_10 = (int)iVar3;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x19f0b9e);
  for (local_48 = 0; local_48 < local_10; local_48 = local_48 + 1) {
    TPZCompMesh::ConnectVec((TPZCompMesh *)*in_RDI);
    local_50 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (in_stack_fffffffffffffa10,(int64_t)in_stack_fffffffffffffa08);
    iVar3 = TPZConnect::SequenceNumber(local_50);
    local_60 = (int)iVar3;
    if (-1 < local_60) {
      TPZCompMesh::Block((TPZCompMesh *)*in_RDI);
      in_stack_fffffffffffffcac =
           TPZBlock::Size((TPZBlock *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
      local_64 = in_stack_fffffffffffffcac;
      in_stack_fffffffffffffca8 = TPZConnect::HasDependency(local_50);
      if (in_stack_fffffffffffffca8 != 0) {
        in_stack_fffffffffffffca0 = TPZConnect::FirstDepend(local_50);
        for (local_70 = in_stack_fffffffffffffca0; local_70 != (TPZDepend *)0x0;
            local_70 = local_70->fNext) {
          iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)&local_70->fDepMatrix);
          local_74 = (int)iVar3;
          iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)&local_70->fDepMatrix);
          local_78 = (int)iVar3;
          local_7c = (int)local_70->fDepConnectIndex;
          TPZCompMesh::ConnectVec((TPZCompMesh *)*in_RDI);
          local_88 = TPZChunkVector<TPZConnect,_10>::operator[]
                               (in_stack_fffffffffffffa10,(int64_t)in_stack_fffffffffffffa08);
          iVar3 = TPZConnect::SequenceNumber(local_88);
          local_8c = (undefined4)iVar3;
          TPZCompMesh::Block((TPZCompMesh *)*in_RDI);
          local_90 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec)
          ;
          if ((local_74 * *(int *)(in_RDI + 2) != local_64) ||
             (local_78 * *(int *)(in_RDI + 2) != local_90)) {
            pVar10 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                               ((set<long,_std::less<long>,_std::allocator<long>_> *)
                                in_stack_fffffffffffffa10,
                                (value_type_conflict5 *)in_stack_fffffffffffffa08);
            local_a0 = (_Base_ptr)pVar10.first._M_node;
            local_98 = pVar10.second;
            poVar4 = std::operator<<((ostream *)&std::cout,"TPZCheckMesh::CheckConstraintDi.. ic = "
                                    );
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_48);
            poVar4 = std::operator<<(poVar4," depends on ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_7c);
            poVar4 = std::operator<<(poVar4," r ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_74);
            poVar4 = std::operator<<(poVar4," iblsize ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_64);
            poVar4 = std::operator<<(poVar4," c ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_78);
            poVar4 = std::operator<<(poVar4," jblsize ");
            pvVar5 = (void *)std::ostream::operator<<(poVar4,local_90);
            std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
            local_c = 1;
          }
        }
      }
    }
  }
  TPZCompMesh::NConnects((TPZCompMesh *)0x19f1067);
  local_c8 = 0xffffffffffffffff;
  TPZVec<long>::TPZVec
            (in_stack_fffffffffffffa00,(int64_t)in_stack_fffffffffffff9f8,
             (long *)in_stack_fffffffffffff9f0);
  local_d0 = TPZCompMesh::NElements((TPZCompMesh *)0x19f10ac);
  for (local_d8 = 0; local_d8 < local_d0; local_d8 = local_d8 + 1) {
    local_e0 = TPZCompMesh::Element
                         (in_stack_fffffffffffff9f0,
                          CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    if (local_e0 != (TPZCompEl *)0x0) {
      local_e4 = (**(code **)(*(long *)local_e0 + 0x90))();
      for (local_e8 = 0; local_e8 < local_e4; local_e8 = local_e8 + 1) {
        local_f0 = (**(code **)(*(long *)local_e0 + 0xa0))(local_e0,local_e8);
        plVar6 = TPZVec<long>::operator[](&local_c0,local_f0);
        lVar8 = local_d8;
        if (*plVar6 == -1) {
          plVar6 = TPZVec<long>::operator[](&local_c0,local_f0);
          *plVar6 = lVar8;
        }
      }
    }
  }
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x19f1271);
  local_128[0]._M_node =
       (_Base_ptr)
       std::set<long,_std::less<long>,_std::allocator<long>_>::begin
                 ((set<long,_std::less<long>,_std::allocator<long>_> *)
                  CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  while( true ) {
    local_130._M_node =
         (_Base_ptr)
         std::set<long,_std::less<long>,_std::allocator<long>_>::end
                   ((set<long,_std::less<long>,_std::allocator<long>_> *)
                    CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    bVar1 = std::operator!=(local_128,&local_130);
    if (!bVar1) break;
    plVar7 = std::_Rb_tree_const_iterator<long>::operator*
                       ((_Rb_tree_const_iterator<long> *)0x19f12c6);
    plVar6 = TPZVec<long>::operator[](&local_c0,*plVar7);
    if (*plVar6 == -1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Connect ");
      plVar7 = std::_Rb_tree_const_iterator<long>::operator*
                         ((_Rb_tree_const_iterator<long> *)0x19f1318);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*plVar7);
      std::operator<<(poVar4," has dependency but does not belong to an element\n");
    }
    plVar7 = std::_Rb_tree_const_iterator<long>::operator*
                       ((_Rb_tree_const_iterator<long> *)0x19f1383);
    TPZVec<long>::operator[](&local_c0,*plVar7);
    local_138 = TPZCompMesh::Element
                          (in_stack_fffffffffffff9f0,
                           CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    if (local_138 == (TPZCompEl *)0x0) {
      local_488 = (long *)0x0;
    }
    else {
      local_488 = (long *)__dynamic_cast(local_138,&TPZCompEl::typeinfo,
                                         &TPZInterpolatedElement::typeinfo,0);
    }
    local_140 = local_488;
    if (local_488 == (long *)0x0) {
      std::operator<<((ostream *)&std::cout,"I dont understand\n");
    }
    else {
      local_144 = (**(code **)(*local_488 + 0x90))();
      for (local_148 = 0; local_148 < local_144; local_148 = local_148 + 1) {
        lVar8 = (**(code **)(*local_140 + 0xa0))(local_140,local_148);
        plVar7 = std::_Rb_tree_const_iterator<long>::operator*
                           ((_Rb_tree_const_iterator<long> *)0x19f14cb);
        if (lVar8 == *plVar7) {
          local_150 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffff9f8);
          TPZGeoElSide::TPZGeoElSide
                    ((TPZGeoElSide *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                     (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20));
          TPZGeoElSide::LowerLevelCompElementList2
                    ((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                     (int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
          bVar1 = TPZCompElSide::operator_cast_to_bool(local_178);
          if (bVar1) {
            TPZCompElSide::Reference(in_stack_fffffffffffffa08);
            TPZStack<TPZCompElSide,_10>::TPZStack
                      ((TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffa00);
            TPZGeoElSide::EqualLevelCompElementList
                      (in_stack_fffffffffffffb00,
                       (TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffaf8,
                       (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                       (int)in_stack_fffffffffffffaf0);
            TPZCompElSide::TPZCompElSide(&local_268,local_178);
            TPZStack<TPZCompElSide,_10>::Push
                      ((TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffa00,
                       (TPZCompElSide *)in_stack_fffffffffffff9f8);
            poVar4 = std::operator<<((ostream *)&std::cout,"Connect index ");
            plVar7 = std::_Rb_tree_const_iterator<long>::operator*
                               ((_Rb_tree_const_iterator<long> *)0x19f163d);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,*plVar7);
            poVar4 = std::operator<<(poVar4," belongs to element ");
            plVar7 = std::_Rb_tree_const_iterator<long>::operator*
                               ((_Rb_tree_const_iterator<long> *)0x19f1682);
            plVar6 = TPZVec<long>::operator[](&local_c0,*plVar7);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,*plVar6);
            std::operator<<(poVar4," and is restrained by element ");
            for (local_26c = 0; lVar8 = (long)local_26c,
                iVar3 = TPZVec<TPZCompElSide>::size(local_258), lVar8 < iVar3;
                local_26c = local_26c + 1) {
              this_01 = TPZVec<TPZCompElSide>::operator[](local_258,(long)local_26c);
              pTVar9 = TPZCompElSide::Element(this_01);
              iVar3 = TPZCompEl::Index(pTVar9);
              in_stack_fffffffffffffb00 = (TPZGeoElSide *)std::ostream::operator<<(&std::cout,iVar3)
              ;
              std::operator<<((ostream *)in_stack_fffffffffffffb00," ");
            }
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            in_stack_fffffffffffffaf8 = TPZCompElSide::Element(local_178);
            in_stack_fffffffffffffaf0 = TPZCompEl::Index(in_stack_fffffffffffffaf8);
            local_278 = in_stack_fffffffffffffaf0;
            pVar10 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                               ((set<long,_std::less<long>,_std::allocator<long>_> *)
                                in_stack_fffffffffffffa10,
                                (value_type_conflict5 *)in_stack_fffffffffffffa08);
            local_288 = (_Base_ptr)pVar10.first._M_node;
            local_280 = pVar10.second;
            pTVar9 = TPZCompElSide::Element(local_178);
            local_28c = (**(code **)(*(long *)pTVar9 + 0x90))();
            std::set<long,_std::less<long>,_std::allocator<long>_>::set
                      ((set<long,_std::less<long>,_std::allocator<long>_> *)0x19f18d0);
            for (local_2c4 = 0; local_2c4 < local_28c; local_2c4 = local_2c4 + 1) {
              pTVar9 = TPZCompElSide::Element(local_178);
              local_2d0 = (**(code **)(*(long *)pTVar9 + 0xa0))(pTVar9,local_2c4);
              pVar10 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                                 ((set<long,_std::less<long>,_std::allocator<long>_> *)
                                  in_stack_fffffffffffffa10,
                                  (value_type_conflict5 *)in_stack_fffffffffffffa08);
              local_2e0 = (_Base_ptr)pVar10.first._M_node;
              local_2d8 = pVar10.second;
            }
            TPZCompMesh::ConnectVec((TPZCompMesh *)*in_RDI);
            std::_Rb_tree_const_iterator<long>::operator*
                      ((_Rb_tree_const_iterator<long> *)0x19f19e2);
            local_2e8 = TPZChunkVector<TPZConnect,_10>::operator[]
                                  (in_stack_fffffffffffffa10,(int64_t)in_stack_fffffffffffffa08);
            for (local_2f0 = TPZConnect::FirstDepend(local_2e8); local_2f0 != (TPZDepend *)0x0;
                local_2f0 = local_2f0->fNext) {
              local_2f8._M_node =
                   (_Base_ptr)
                   std::set<long,_std::less<long>,_std::allocator<long>_>::find
                             ((set<long,_std::less<long>,_std::allocator<long>_> *)
                              in_stack_fffffffffffff9f8,
                              (key_type_conflict1 *)in_stack_fffffffffffff9f0);
              local_300._M_node =
                   (_Base_ptr)
                   std::set<long,_std::less<long>,_std::allocator<long>_>::end
                             ((set<long,_std::less<long>,_std::allocator<long>_> *)
                              CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
              bVar1 = std::operator==(&local_2f8,&local_300);
              if (bVar1) {
                poVar4 = std::operator<<((ostream *)&std::cout,"The connect ");
                plVar7 = std::_Rb_tree_const_iterator<long>::operator*
                                   ((_Rb_tree_const_iterator<long> *)0x19f1ad2);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,*plVar7);
                poVar4 = std::operator<<(poVar4," belongs to element ");
                plVar7 = std::_Rb_tree_const_iterator<long>::operator*
                                   ((_Rb_tree_const_iterator<long> *)0x19f1b17);
                plVar6 = TPZVec<long>::operator[](&local_c0,*plVar7);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,*plVar6);
                poVar4 = std::operator<<(poVar4," as connect ");
                pvVar5 = (void *)std::ostream::operator<<(poVar4,local_148);
                std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
                poVar4 = std::operator<<((ostream *)&std::cout,
                                         "The element is restrained along this side to element ");
                pTVar9 = TPZCompElSide::Element(local_178);
                iVar3 = TPZCompEl::Index(pTVar9);
                pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar3);
                std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
                poVar4 = std::operator<<((ostream *)&std::cout,"The connect ");
                plVar7 = std::_Rb_tree_const_iterator<long>::operator*
                                   ((_Rb_tree_const_iterator<long> *)0x19f1c28);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,*plVar7);
                poVar4 = std::operator<<(poVar4," depends on connect ");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2f0->fDepConnectIndex);
                std::operator<<(poVar4," The connect of the large element are ");
                for (local_304 = 0; (int)local_304 < local_28c; local_304 = local_304 + 1) {
                  in_stack_fffffffffffffa10 =
                       (TPZChunkVector<TPZConnect,_10> *)TPZCompElSide::Element(local_178);
                  iVar2 = (*(in_stack_fffffffffffffa10->super_TPZSavable)._vptr_TPZSavable[0x14])
                                    (in_stack_fffffffffffffa10,(ulong)local_304);
                  in_stack_fffffffffffffa08 = (TPZCompElSide *)CONCAT44(extraout_var,iVar2);
                  in_stack_fffffffffffffa00 =
                       (TPZVec<long> *)
                       std::ostream::operator<<(&std::cout,(long)in_stack_fffffffffffffa08);
                  std::operator<<((ostream *)in_stack_fffffffffffffa00," ");
                }
                std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
              }
            }
            std::set<long,_std::less<long>,_std::allocator<long>_>::~set
                      ((set<long,_std::less<long>,_std::allocator<long>_> *)0x19f1d55);
            TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x19f1d62);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x19f1d6f);
            local_17c = 0;
          }
          else {
            std::operator<<((ostream *)&std::cout,"I dont understand\n");
            local_17c = 0x12;
          }
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x19f1d87);
        }
      }
    }
    local_310 = (_Base_ptr)
                std::_Rb_tree_const_iterator<long>::operator++
                          ((_Rb_tree_const_iterator<long> *)in_stack_fffffffffffff9f8,
                           (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20));
  }
  local_318._M_node =
       (_Base_ptr)
       std::set<long,_std::less<long>,_std::allocator<long>_>::begin
                 ((set<long,_std::less<long>,_std::allocator<long>_> *)
                  CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  while( true ) {
    local_320._M_node =
         (_Base_ptr)
         std::set<long,_std::less<long>,_std::allocator<long>_>::end
                   ((set<long,_std::less<long>,_std::allocator<long>_> *)
                    CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    bVar1 = std::operator!=(&local_318,&local_320);
    if (!bVar1) break;
    in_stack_fffffffffffff9f0 = (TPZCompMesh *)*in_RDI;
    std::_Rb_tree_const_iterator<long>::operator*((_Rb_tree_const_iterator<long> *)0x19f1e5c);
    pTVar9 = TPZCompMesh::Element
                       (in_stack_fffffffffffff9f0,
                        CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    (**(code **)(*(long *)pTVar9 + 200))(pTVar9,&std::cout);
    std::_Rb_tree_const_iterator<long>::operator++
              ((_Rb_tree_const_iterator<long> *)pTVar9,
               (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20));
  }
  local_17c = 1;
  iVar2 = local_c;
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x19f1ecb);
  TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_fffffffffffff9f0);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x19f1ee5);
  return iVar2;
}

Assistant:

int TPZCheckMesh::CheckConstraintDimension()
{
	int check = 0;
	int ncon = fMesh->ConnectVec().NElements();
    std::set<int64_t> badcon;
	for(int64_t ic=0; ic<ncon; ic++) {
		TPZConnect &con = fMesh->ConnectVec()[ic];
		int iseqnum = con.SequenceNumber();
        if (iseqnum < 0) {
            continue;
        }
		int iblsize = fMesh->Block().Size(iseqnum);
		if(con.HasDependency()) {
			TPZConnect::TPZDepend *dep = con.FirstDepend();
			while(dep) {
				int r = dep->fDepMatrix.Rows();
				int c = dep->fDepMatrix.Cols();
				int jcind = dep->fDepConnectIndex;
				TPZConnect &jcon = fMesh->ConnectVec()[jcind];
				int jseqnum = jcon.SequenceNumber();
				int jblsize = fMesh->Block().Size(jseqnum);
				if(r*fNState != iblsize || c*fNState != jblsize) {
                    badcon.insert(ic);
					cout << "TPZCheckMesh::CheckConstraintDi.. ic = " << ic
					<< " depends on " << jcind << " r " << r << " iblsize "
					<< iblsize  << " c " << c << " jblsize " << jblsize << endl;
					check = 1;
				}
				dep = dep->fNext;
			}
		}
	}
    TPZVec<int64_t> connecttoel(fMesh->NConnects(),-1);
    int64_t nelem = fMesh->NElements();
    for (int64_t el=0; el<nelem; el++) {
        TPZCompEl *cel = fMesh->Element(el);
        if (!cel) {
            continue;
        }
        int nc = cel->NConnects();
        for (int ic=0; ic<nc; ic++) {
            int64_t cindex = cel->ConnectIndex(ic);
            if (connecttoel[cindex] == -1) {
                connecttoel[cindex] = el;
            }
        }
    }
    std::set<int64_t> badelements;
    for (std::set<int64_t>::iterator it = badcon.begin(); it != badcon.end(); it++) {
        /// find the element that contains badcon
        if (connecttoel[*it] == -1) {
            std::cout << "Connect " << *it << " has dependency but does not belong to an element\n";
        }
        TPZCompEl *cel = fMesh->Element(connecttoel[*it]);
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
        if (!intel) {
            std::cout << "I dont understand\n";
            continue;
        }
        int nc = intel->NConnects();
        for (int ic = 0; ic<nc; ic++) {
            if (intel->ConnectIndex(ic) == *it)
            {
                TPZGeoEl *ref = intel->Reference();
                TPZGeoElSide gelside(ref,ic);
                TPZCompElSide large = gelside.LowerLevelCompElementList2(1);
                if (!large) {
                    std::cout << "I dont understand\n";
                    continue;
                }
                TPZGeoElSide gellarge = large.Reference();
                TPZStack<TPZCompElSide> equal;
                gellarge.EqualLevelCompElementList(equal, 1, 0);
                equal.Push(large);
                std::cout << "Connect index " << *it << " belongs to element " << connecttoel[*it] << " and is restrained by element ";
                for(int i=0; i< equal.size(); i++) std::cout << equal[i].Element()->Index() << " ";
                std::cout << std::endl;
                badelements.insert(large.Element()->Index());
                
                int nclarge = large.Element()->NConnects();
                std::set<int64_t> largecon;
                for (int icl=0; icl< nclarge; icl++) {
                    largecon.insert(large.Element()->ConnectIndex(icl));
                }
                TPZConnect &c = fMesh->ConnectVec()[*it];
                TPZConnect::TPZDepend *dep = c.FirstDepend();
                while(dep)
                {
                    if (largecon.find(dep->fDepConnectIndex) == largecon.end()) {
                        std::cout << "The connect " << *it << " belongs to element " << connecttoel[*it] << " as connect " << ic << std::endl;
                        std::cout << "The element is restrained along this side to element " << large.Element()->Index() << std::endl;
                        std::cout << "The connect " << *it << " depends on connect " << dep->fDepConnectIndex << " The connect of the large element are ";
                        for (int ic=0; ic<nclarge; ic++) {
                            std::cout << large.Element()->ConnectIndex(ic) << " ";
                        }
                        std::cout << std::endl;
                    }
                    dep = dep->fNext;
                }
            }
        }
    }
    for (std::set<int64_t>::iterator it=badelements.begin(); it != badelements.end(); it++) {
        fMesh->Element(*it)->Print();
    }
	return check;
}